

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tls.c
# Opt level: O0

void al_set_standard_fs_interface(void)

{
  ALLEGRO_FS_INTERFACE *unaff_retaddr;
  
  al_set_fs_interface(unaff_retaddr);
  return;
}

Assistant:

void al_set_standard_fs_interface(void)
{
   al_set_fs_interface(&_al_fs_interface_stdio);
}